

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

int __thiscall
CVmObjFrameDesc::getp_is_active(CVmObjFrameDesc *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_val_t *in_RDX;
  uint *in_RDI;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  vm_val_t *in_stack_ffffffffffffffc8;
  
  if ((getp_is_active(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_is_active(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_is_active::desc,0);
    __cxa_guard_release(&getp_is_active(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(in_stack_ffffffffffffffc8,in_RDI,in_stack_ffffffffffffffb8)
  ;
  if (iVar1 == 0) {
    get_frame_ref((CVmObjFrameDesc *)0x35262b);
    iVar1 = CVmObjFrameRef::is_active((CVmObjFrameRef *)0x352633);
    vm_val_t::set_logical(in_RDX,iVar1);
  }
  return 1;
}

Assistant:

int CVmObjFrameDesc::getp_is_active(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                    uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* the frame is valid if we still have a frame pointer */
    retval->set_logical(get_frame_ref(vmg0_)->is_active());

    /* handled */
    return TRUE;
}